

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::GRULayerParams::ByteSizeLong(GRULayerParams *this)

{
  uint uVar1;
  long lVar2;
  Type *value;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  uint i;
  uint index;
  ulong uVar6;
  
  uVar1 = (this->activations_).super_RepeatedPtrFieldBase.current_size_;
  uVar6 = (ulong)uVar1;
  for (index = 0; uVar1 != index; index = index + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                      (&(this->activations_).super_RepeatedPtrFieldBase,index);
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::ActivationParams>(value);
    uVar6 = uVar6 + sVar3;
  }
  if (this != (GRULayerParams *)&_GRULayerParams_default_instance_ &&
      this->updategateweightmatrix_ != (WeightParams *)0x0) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->updategateweightmatrix_)
    ;
    uVar6 = uVar6 + sVar3 + 2;
  }
  if (this->resetgateweightmatrix_ != (WeightParams *)0x0 &&
      this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->resetgateweightmatrix_);
    uVar6 = uVar6 + sVar3 + 2;
  }
  if (this->outputgateweightmatrix_ != (WeightParams *)0x0 &&
      this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->outputgateweightmatrix_)
    ;
    uVar6 = uVar6 + sVar3 + 2;
  }
  if (this->updategaterecursionmatrix_ != (WeightParams *)0x0 &&
      this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>
                      (this->updategaterecursionmatrix_);
    uVar6 = uVar6 + sVar3 + 2;
  }
  if (this->resetgaterecursionmatrix_ != (WeightParams *)0x0 &&
      this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>
                      (this->resetgaterecursionmatrix_);
    uVar6 = uVar6 + sVar3 + 2;
  }
  if (this->outputgaterecursionmatrix_ != (WeightParams *)0x0 &&
      this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>
                      (this->outputgaterecursionmatrix_);
    uVar6 = uVar6 + sVar3 + 2;
  }
  if (this->updategatebiasvector_ != (WeightParams *)0x0 &&
      this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->updategatebiasvector_);
    uVar6 = uVar6 + sVar3 + 2;
  }
  if (this->resetgatebiasvector_ != (WeightParams *)0x0 &&
      this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->resetgatebiasvector_);
    uVar6 = uVar6 + sVar3 + 2;
  }
  if (this->outputgatebiasvector_ != (WeightParams *)0x0 &&
      this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->outputgatebiasvector_);
    uVar6 = uVar6 + sVar3 + 2;
  }
  if (this->inputvectorsize_ != 0) {
    uVar4 = this->inputvectorsize_ | 1;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    uVar6 = uVar6 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->outputvectorsize_ != 0) {
    uVar4 = this->outputvectorsize_ | 1;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    uVar6 = uVar6 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
  }
  sVar3 = uVar6 + 2;
  if (this->sequenceoutput_ == false) {
    sVar3 = uVar6;
  }
  sVar5 = sVar3 + 3;
  if (this->hasbiasvectors_ == false) {
    sVar5 = sVar3;
  }
  sVar3 = sVar5 + 3;
  if (this->reverseinput_ == false) {
    sVar3 = sVar5;
  }
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

size_t GRULayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.GRULayerParams)
  size_t total_size = 0;

  // repeated .CoreML.Specification.ActivationParams activations = 10;
  {
    unsigned int count = this->activations_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->activations(i));
    }
  }

  // .CoreML.Specification.WeightParams updateGateWeightMatrix = 30;
  if (this->has_updategateweightmatrix()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->updategateweightmatrix_);
  }

  // .CoreML.Specification.WeightParams resetGateWeightMatrix = 31;
  if (this->has_resetgateweightmatrix()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->resetgateweightmatrix_);
  }

  // .CoreML.Specification.WeightParams outputGateWeightMatrix = 32;
  if (this->has_outputgateweightmatrix()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->outputgateweightmatrix_);
  }

  // .CoreML.Specification.WeightParams updateGateRecursionMatrix = 50;
  if (this->has_updategaterecursionmatrix()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->updategaterecursionmatrix_);
  }

  // .CoreML.Specification.WeightParams resetGateRecursionMatrix = 51;
  if (this->has_resetgaterecursionmatrix()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->resetgaterecursionmatrix_);
  }

  // .CoreML.Specification.WeightParams outputGateRecursionMatrix = 52;
  if (this->has_outputgaterecursionmatrix()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->outputgaterecursionmatrix_);
  }

  // .CoreML.Specification.WeightParams updateGateBiasVector = 70;
  if (this->has_updategatebiasvector()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->updategatebiasvector_);
  }

  // .CoreML.Specification.WeightParams resetGateBiasVector = 71;
  if (this->has_resetgatebiasvector()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->resetgatebiasvector_);
  }

  // .CoreML.Specification.WeightParams outputGateBiasVector = 72;
  if (this->has_outputgatebiasvector()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->outputgatebiasvector_);
  }

  // uint64 inputVectorSize = 1;
  if (this->inputvectorsize() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->inputvectorsize());
  }

  // uint64 outputVectorSize = 2;
  if (this->outputvectorsize() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->outputvectorsize());
  }

  // bool sequenceOutput = 15;
  if (this->sequenceoutput() != 0) {
    total_size += 1 + 1;
  }

  // bool hasBiasVectors = 20;
  if (this->hasbiasvectors() != 0) {
    total_size += 2 + 1;
  }

  // bool reverseInput = 100;
  if (this->reverseinput() != 0) {
    total_size += 2 + 1;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}